

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O1

void PrintInstruction(InstructionRegVmLowerGraphContext *ctx,char *constantData,
                     RegVmLoweredInstruction *lowInstruction)

{
  byte *pbVar1;
  char *pcVar2;
  SynBase *pSVar3;
  char *pcVar4;
  VmConstant *constant;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint local_58;
  
  if (((ctx->showSource == true) && (pSVar3 = lowInstruction->location, pSVar3 != (SynBase *)0x0))
     && (pSVar3->isInternal == false)) {
    pcVar4 = (pSVar3->pos).begin;
    iVar5 = -(int)pcVar4;
    uVar9 = 0;
    lVar14 = 0;
    do {
      lVar8 = lVar14;
      uVar13 = (ulong)uVar9;
      pcVar2 = pcVar4 + lVar8;
      if ((pcVar2 <= ctx->code) || (pcVar4[lVar8 + -1] == '\r')) break;
      uVar9 = uVar9 + 1;
      lVar14 = lVar8 + -1;
    } while (pcVar4[lVar8 + -1] != '\n');
    uVar10 = -lVar8;
    uVar12 = uVar10 & 0xffffffff;
    pcVar11 = pcVar4;
    do {
      do {
        pbVar1 = (byte *)(pcVar11 + 1);
        pcVar11 = pcVar11 + 1;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (0xd < *pbVar1);
    } while ((0x2401U >> (*pbVar1 & 0x1f) & 1) == 0);
    if (ctx->showAnnotatedSource == true) {
      iVar6 = (int)lVar8;
      iVar7 = (int)(pSVar3->pos).end;
      if (((pcVar2 != ctx->lastStart) || (-ctx->lastStartOffset != iVar6)) ||
         ((iVar7 - ctx->lastEndOffset) + iVar5 != iVar6)) {
        uVar9 = (iVar5 + iVar7) - iVar6;
        Print(ctx->output,"// %.*s",uVar12,pcVar2);
        OutputContext::Print(ctx->output,"\n",1);
        OutputContext::Print(ctx->output,"  ",2);
        local_58 = (uint)uVar10;
        if ((lowInstruction->location->pos).end < pcVar11) {
          Print(ctx->output,"// ");
          if (iVar6 != 0) {
            uVar12 = 0;
            do {
              Print(ctx->output," ");
              if (pcVar4[lVar8 + uVar12] == '\t') {
                pcVar11 = "   ";
                if (uVar12 == 0) {
                  pcVar11 = "  ";
                }
                Print(ctx->output,pcVar11);
              }
              uVar12 = uVar12 + 1;
            } while ((uVar10 & 0xffffffff) != uVar12);
          }
          if (local_58 < uVar9) {
            lVar14 = 0;
            do {
              Print(ctx->output,"~");
              if (pcVar4[lVar14 + lVar8 + uVar13] == '\t') {
                pcVar11 = "~~~";
                if (-(uVar10 & 0xffffffff) == lVar14) {
                  pcVar11 = "~~";
                }
                Print(ctx->output,pcVar11);
              }
              lVar14 = lVar14 + 1;
            } while (iVar7 - (int)pcVar4 != (int)lVar14);
          }
          OutputContext::Print(ctx->output,"\n",1);
          OutputContext::Print(ctx->output,"  ",2);
        }
        ctx->lastStart = pcVar2;
        ctx->lastStartOffset = local_58;
        ctx->lastEndOffset = uVar9;
      }
    }
    else if (pcVar2 != ctx->lastStart) {
      Print(ctx->output,"// %.*s",uVar12,pcVar2);
      OutputContext::Print(ctx->output,"\n",1);
      OutputContext::Print(ctx->output,"  ",2);
      ctx->lastStart = pcVar2;
    }
  }
  constant = lowInstruction->argument;
  if (constant == (VmConstant *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = constant->iValue;
  }
  PrintInstruction(ctx->output,constantData,(ExternFuncInfo *)0x0,(char *)0x0,lowInstruction->code,
                   lowInstruction->rA,lowInstruction->rB,lowInstruction->rC,uVar9,constant);
  if (((lowInstruction->preKillRegisters).count != 0) ||
     ((lowInstruction->postKillRegisters).count != 0)) {
    Print(ctx->output,"\t// kill[");
    if ((lowInstruction->preKillRegisters).count != 0) {
      uVar13 = 0;
      do {
        if (uVar13 != 0) {
          Print(ctx->output,", ");
        }
        if ((lowInstruction->preKillRegisters).count <= uVar13) goto LAB_0027cce6;
        Print(ctx->output,"r%d*",(ulong)(lowInstruction->preKillRegisters).data[uVar13]);
        uVar13 = uVar13 + 1;
      } while (uVar13 < (lowInstruction->preKillRegisters).count);
    }
    if ((lowInstruction->postKillRegisters).count != 0) {
      uVar13 = 0;
      do {
        if ((uVar13 != 0) || ((lowInstruction->preKillRegisters).count != 0)) {
          Print(ctx->output,", ");
        }
        if ((lowInstruction->postKillRegisters).count <= uVar13) {
LAB_0027cce6:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<unsigned char, 8>::operator[](unsigned int) [T = unsigned char, N = 8]"
                       );
        }
        Print(ctx->output,"r%d",(ulong)(lowInstruction->postKillRegisters).data[uVar13]);
        uVar13 = uVar13 + 1;
      } while (uVar13 < (lowInstruction->postKillRegisters).count);
    }
    Print(ctx->output,"]");
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void PrintInstruction(InstructionRegVmLowerGraphContext &ctx, char *constantData, RegVmLoweredInstruction *lowInstruction)
{
	if(ctx.showSource && lowInstruction->location && !lowInstruction->location->isInternal)
	{
		const char *start = lowInstruction->location->pos.begin;
		const char *end = start + 1;

		// TODO: handle source locations from imported modules
		while(start > ctx.code && *(start - 1) != '\r' && *(start - 1) != '\n')
			start--;

		while(*end && *end != '\r' && *end != '\n')
			end++;

		if (ctx.showAnnotatedSource)
		{
			unsigned startOffset = unsigned(lowInstruction->location->pos.begin - start);
			unsigned endOffset = unsigned(lowInstruction->location->pos.end - start);

			if(start != ctx.lastStart || startOffset != ctx.lastStartOffset || endOffset != ctx.lastEndOffset)
			{
				Print(ctx.output, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx.output);
				PrintIndent(ctx.output);

				if (lowInstruction->location->pos.end < end)
				{
					Print(ctx.output, "// ");

					for (unsigned i = 0; i < startOffset; i++)
					{
						Print(ctx.output, " ");

						if (start[i] == '\t')
							Print(ctx.output, i == 0 ? "  " : "   ");
					}

					for (unsigned i = startOffset; i < endOffset; i++)
					{
						Print(ctx.output, "~");

						if (start[i] == '\t')
							Print(ctx.output, i == 0 ? "~~" : "~~~");
					}

					PrintLine(ctx.output);
					PrintIndent(ctx.output);
				}

				ctx.lastStart = start;
				ctx.lastStartOffset = startOffset;
				ctx.lastEndOffset = endOffset;
			}
		}
		else
		{
			if(start != ctx.lastStart)
			{
				Print(ctx.output, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx.output);
				PrintIndent(ctx.output);

				ctx.lastStart = start;
			}
		}
	}

	PrintInstruction(ctx.output, constantData, NULL, NULL, RegVmInstructionCode(lowInstruction->code), lowInstruction->rA, lowInstruction->rB, lowInstruction->rC, lowInstruction->argument ? lowInstruction->argument->iValue : 0, lowInstruction->argument);

	if(!lowInstruction->preKillRegisters.empty() || !lowInstruction->postKillRegisters.empty())
	{
		Print(ctx.output, "\t// kill[");

		for(unsigned i = 0; i < lowInstruction->preKillRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d*", lowInstruction->preKillRegisters[i]);
		}

		for(unsigned i = 0; i < lowInstruction->postKillRegisters.size(); i++)
		{
			if(i != 0 || !lowInstruction->preKillRegisters.empty())
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowInstruction->postKillRegisters[i]);
		}

		Print(ctx.output, "]");
	}

	PrintLine(ctx.output);
}